

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

_Bool upb_Message_HasBaseField(upb_Message *msg,upb_MiniTableField *field)

{
  ushort uVar1;
  _Bool _Var2;
  
  if ((field->mode_dont_copy_me__upb_internal_use_only & 8) == 0) {
    uVar1 = field->presence;
    if (uVar1 != 0) {
      if ((short)uVar1 < 0) {
        _Var2 = *(uint32_t *)((long)&msg->field_0 + (ulong)(uVar1 ^ 0xffff)) ==
                field->number_dont_copy_me__upb_internal_use_only;
      }
      else {
        _Var2 = (*(byte *)((long)&msg->field_0 + (ulong)(uVar1 >> 3)) >> (uVar1 & 7) & 1) != 0;
      }
      return _Var2;
    }
  }
  else if ((field->mode_dont_copy_me__upb_internal_use_only & 3) == 2) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/accessors.h"
                  ,0xfb,
                  "_Bool upb_Message_HasBaseField(const struct upb_Message *, const upb_MiniTableField *)"
                 );
  }
  __assert_fail("upb_MiniTableField_HasPresence(field)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/accessors.h"
                ,0xfa,
                "_Bool upb_Message_HasBaseField(const struct upb_Message *, const upb_MiniTableField *)"
               );
}

Assistant:

UPB_API_INLINE bool upb_Message_HasBaseField(const struct upb_Message* msg,
                                             const upb_MiniTableField* field) {
  UPB_ASSERT(upb_MiniTableField_HasPresence(field));
  UPB_ASSUME(!upb_MiniTableField_IsExtension(field));
  if (upb_MiniTableField_IsInOneof(field)) {
    return UPB_PRIVATE(_upb_Message_GetOneofCase)(msg, field) ==
           upb_MiniTableField_Number(field);
  } else {
    return UPB_PRIVATE(_upb_Message_GetHasbit)(msg, field);
  }
}